

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_stream_write(nh_stream_t *stream,char *fmt,...)

{
  char in_AL;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  va_list args;
  
  args[0].overflow_arg_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000010;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf(stream->buf + stream->length,(ulong)(stream->capacity - stream->length),fmt,
                    &local_38);
  uVar2 = stream->length + iVar1;
  uVar5 = stream->capacity;
  if (uVar5 < uVar2) {
    do {
      uVar5 = uVar5 * 2;
    } while (uVar5 < uVar2);
    stream->capacity = uVar5;
    pcVar4 = (char *)realloc(stream->buf,(ulong)uVar5);
    stream->buf = pcVar4;
    if (pcVar4 == (char *)0x0) {
      __assert_fail("stream->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                    ,0x15c,"void nh_stream_write(nh_stream_t *, const char *, ...)");
    }
    iVar3 = vsnprintf(pcVar4 + stream->length,(ulong)(stream->capacity - stream->length),fmt,
                      &local_38);
    uVar2 = iVar3 + iVar1 + stream->length;
  }
  stream->length = uVar2;
  return;
}

Assistant:

void nh_stream_write(nh_stream_t *stream, char const fmt[static 1], ...) {
    va_list args;
    va_start(args, fmt);

    int bytes = vsnprintf(stream->buf + stream->length, stream->capacity - stream->length, fmt, args);
    if (bytes + stream->length > stream->capacity) {
        while (bytes + stream->length > stream->capacity) stream->capacity *= 2;
        stream->buf = (char *) realloc(stream->buf, stream->capacity);
        assert(stream->buf != NULL);
        bytes += vsnprintf(stream->buf + stream->length, stream->capacity - stream->length, fmt, args);
    }
    stream->length += bytes;

    va_end(args);
}